

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lock.cpp
# Opt level: O1

bool __thiscall Threading::MutexLock::_Lock(MutexLock *this,TimeOut *rcxTO)

{
  __time_t _Var1;
  __suseconds_t _Var2;
  int iVar3;
  bool bVar4;
  timeval tOut;
  timeval local_48;
  timeval local_38;
  
  if (rcxTO->duration == 0) {
    iVar3 = pthread_mutex_trylock((pthread_mutex_t *)this);
  }
  else {
    if (rcxTO->duration != 0xffffffff) {
      gettimeofday(&local_48,(__timezone_ptr_t)0x0);
      local_48.tv_usec = (ulong)(rcxTO->duration * 1000) + local_48.tv_usec;
      if (1000000 < local_48.tv_usec) {
        local_48.tv_sec = local_48.tv_sec + 1;
        local_48.tv_usec = local_48.tv_usec + -1000000;
      }
      gettimeofday(&local_38,(__timezone_ptr_t)0x0);
      _Var2 = local_48.tv_usec;
      _Var1 = local_48.tv_sec;
      bVar4 = local_38.tv_usec < local_48.tv_usec || local_38.tv_sec < local_48.tv_sec;
      if (local_38.tv_usec >= local_48.tv_usec && local_38.tv_sec >= local_48.tv_sec) {
        return bVar4;
      }
      iVar3 = pthread_mutex_trylock((pthread_mutex_t *)this);
      if (iVar3 == 0) {
        return bVar4;
      }
      do {
        sched_yield();
        gettimeofday(&local_38,(__timezone_ptr_t)0x0);
        bVar4 = local_38.tv_usec < _Var2 || local_38.tv_sec < _Var1;
        if (local_38.tv_usec >= _Var2 && local_38.tv_sec >= _Var1) {
          return bVar4;
        }
        iVar3 = pthread_mutex_trylock((pthread_mutex_t *)this);
      } while (iVar3 != 0);
      return bVar4;
    }
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  }
  return iVar3 == 0;
}

Assistant:

bool Threading::MutexLock::_Lock(const TimeOut & rcxTO) volatile
{
    if (rcxTO == Infinite)
    {
        // Either pthread_mutex_lock return EINVAL (not initialized), and then it is not going to change
        // as we are the initializer (simply returns false here)
        return pthread_mutex_lock((HMUTEX*)&mutex) == 0;
    }
    else if (rcxTO == InstantCheck)
    {
        return pthread_mutex_trylock((HMUTEX*)&mutex) == 0;
    }
    else
    {   // We need to pool here, sorry
        // Process the absolute time for timeout
        struct timeval tOut;
        gettimeofday(&tOut, NULL);
        tOut.tv_usec += (uint32)rcxTO * 1000;
        if (tOut.tv_usec > 1000000)
        { tOut.tv_sec ++; tOut.tv_usec -= 1000000;  }

        // First try to lock the mutex
        // Sadly, we must poll here
        int retval = -1;
        while (stillBefore(&tOut))
        {
            retval = pthread_mutex_trylock((HMUTEX*)&mutex);
            if (retval == 0) break;
            // We didn't get the mutex, so sleep a little (to avoid CPU intensive wait)
            sched_yield();
        }
        if (retval == 0)
        {   // We now have the mutex, so check the state
            return true;
        }
        return false;
    }
}